

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O2

TRUST_TOKEN_METHOD * TRUST_TOKEN_pst_v1_voprf(void)

{
  return &TRUST_TOKEN_pst_v1_voprf::kMethod;
}

Assistant:

const TRUST_TOKEN_METHOD *TRUST_TOKEN_pst_v1_voprf(void) {
  static const TRUST_TOKEN_METHOD kMethod = {
      voprf_pst1_generate_key,
      voprf_pst1_derive_key_from_secret,
      voprf_pst1_client_key_from_bytes,
      voprf_pst1_issuer_key_from_bytes,
      voprf_pst1_blind,
      voprf_pst1_sign,
      voprf_pst1_unblind,
      voprf_pst1_read,
      0, /* has_private_metadata */
      6, /* max_keys */
      0, /* has_srr */
  };
  return &kMethod;
}